

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

ssize_t __thiscall
httplib::ClientImpl::send(ClientImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ssize_t sVar4;
  undefined8 extraout_RAX;
  id local_d0;
  lock_guard<std::mutex> local_c8;
  lock_guard<std::mutex> guard_1;
  function<bool_(httplib::Stream_&)> local_98;
  byte local_72;
  byte local_71;
  bool ret;
  id iStack_70;
  bool close_connection;
  native_handle_type local_68;
  id local_60;
  int local_54;
  undefined1 local_4e;
  byte local_4d;
  bool shutdown_gracefully;
  bool is_alive;
  lock_guard<std::mutex> local_40;
  lock_guard<std::mutex> guard;
  lock_guard<std::recursive_mutex> request_mutex_guard;
  Error *error_local;
  Response *res_local;
  Request *req_local;
  ClientImpl *this_local;
  
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)&guard,&this->request_mutex_);
  std::lock_guard<std::mutex>::lock_guard(&local_40,&this->socket_mutex_);
  this->socket_should_be_closed_when_request_is_done_ = false;
  local_4d = 0;
  bVar1 = Socket::is_open(&this->socket_);
  if (bVar1) {
    sVar4 = detail::select_write((this->socket_).sock,0,0);
    local_4d = 0 < sVar4;
    if (!(bool)local_4d) {
      local_4e = 0;
      (*this->_vptr_ClientImpl[4])(this,&this->socket_,0);
      shutdown_socket(this,&this->socket_);
      close_socket(this,&this->socket_);
    }
  }
  if (((local_4d & 1) == 0) &&
     (uVar2 = (*this->_vptr_ClientImpl[3])(this,&this->socket_,__n), (uVar2 & 1) == 0)) {
    this_local._7_1_ = 0;
    local_54 = 1;
  }
  else {
    if (1 < this->socket_requests_in_flight_) {
      local_60._M_thread = (this->socket_requests_are_from_thread_)._M_thread;
      local_68 = (native_handle_type)std::this_thread::get_id();
      bVar1 = std::operator==(local_60,(id)local_68);
      if (!bVar1) {
        __assert_fail("socket_requests_are_from_thread_ == std::this_thread::get_id()",
                      "/workspace/llm4binary/github/license_c_cmakelists/junaidrahim[P]locate-route/src/../include/httplib.h"
                      ,0x14b7,"bool httplib::ClientImpl::send(const Request &, Response &, Error &)"
                     );
      }
    }
    this->socket_requests_in_flight_ = this->socket_requests_in_flight_ + 1;
    iStack_70 = std::this_thread::get_id();
    (this->socket_requests_are_from_thread_)._M_thread = iStack_70._M_thread;
    local_54 = 0;
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_40);
  if (local_54 == 0) {
    local_71 = ~this->keep_alive_ & 1;
    guard_1._M_device = (mutex_type *)this;
    std::function<bool(httplib::Stream&)>::
    function<httplib::ClientImpl::send(httplib::Request_const&,httplib::Response&,httplib::Error&)::_lambda(httplib::Stream&)_1_,void>
              ((function<bool(httplib::Stream&)> *)&local_98,(anon_class_40_5_61c9469f *)&guard_1);
    iVar3 = (*this->_vptr_ClientImpl[5])(this,&this->socket_,&local_98);
    std::function<bool_(httplib::Stream_&)>::~function(&local_98);
    local_72 = (byte)iVar3 & 1;
    std::lock_guard<std::mutex>::lock_guard(&local_c8,&this->socket_mutex_);
    this->socket_requests_in_flight_ = this->socket_requests_in_flight_ - 1;
    if (this->socket_requests_in_flight_ == 0) {
      if (this->socket_requests_in_flight_ != 0) {
        __assert_fail("socket_requests_in_flight_ == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/junaidrahim[P]locate-route/src/../include/httplib.h"
                      ,0x14c7,"bool httplib::ClientImpl::send(const Request &, Response &, Error &)"
                     );
      }
      std::thread::id::id(&local_d0);
      (this->socket_requests_are_from_thread_)._M_thread = local_d0._M_thread;
    }
    if ((((this->socket_should_be_closed_when_request_is_done_ & 1U) != 0) || ((local_71 & 1) != 0))
       || ((local_72 & 1) == 0)) {
      (*this->_vptr_ClientImpl[4])(this,&this->socket_,1);
      shutdown_socket(this,&this->socket_);
      close_socket(this,&this->socket_);
    }
    std::lock_guard<std::mutex>::~lock_guard(&local_c8);
    if (((local_72 & 1) == 0) && (*(int *)__n == 0)) {
      *(undefined4 *)__n = 1;
    }
    this_local._7_1_ = local_72 & 1;
    local_54 = 1;
  }
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)&guard);
  return CONCAT71((int7)((ulong)extraout_RAX >> 8),this_local._7_1_) & 0xffffffffffffff01;
}

Assistant:

inline bool ClientImpl::send(const Request &req, Response &res, Error &error) {
		std::lock_guard<std::recursive_mutex> request_mutex_guard(request_mutex_);

		{
			std::lock_guard<std::mutex> guard(socket_mutex_);
			// Set this to false immediately - if it ever gets set to true by the end of
			// the request, we know another thread instructed us to close the socket.
			socket_should_be_closed_when_request_is_done_ = false;

			auto is_alive = false;
			if (socket_.is_open()) {
				is_alive = detail::select_write(socket_.sock, 0, 0) > 0;
				if (!is_alive) {
					// Attempt to avoid sigpipe by shutting down nongracefully if it seems
					// like the other side has already closed the connection Also, there
					// cannot be any requests in flight from other threads since we locked
					// request_mutex_, so safe to close everything immediately
					const bool shutdown_gracefully = false;
					shutdown_ssl(socket_, shutdown_gracefully);
					shutdown_socket(socket_);
					close_socket(socket_);
				}
			}

			if (!is_alive) {
				if (!create_and_connect_socket(socket_, error)) { return false; }

#ifdef CPPHTTPLIB_OPENSSL_SUPPORT
				// TODO: refactoring
      if (is_ssl()) {
        auto &scli = static_cast<SSLClient &>(*this);
        if (!proxy_host_.empty() && proxy_port_ != -1) {
          bool success = false;
          if (!scli.connect_with_proxy(socket_, res, success, error)) {
            return success;
          }
        }

        if (!scli.initialize_ssl(socket_, error)) { return false; }
      }
#endif
			}

			// Mark the current socket as being in use so that it cannot be closed by
			// anyone else while this request is ongoing, even though we will be
			// releasing the mutex.
			if (socket_requests_in_flight_ > 1) {
				assert(socket_requests_are_from_thread_ == std::this_thread::get_id());
			}
			socket_requests_in_flight_ += 1;
			socket_requests_are_from_thread_ = std::this_thread::get_id();
		}

		auto close_connection = !keep_alive_;
		auto ret = process_socket(socket_, [&](Stream &strm) {
			return handle_request(strm, req, res, close_connection, error);
		});

		// Briefly lock mutex in order to mark that a request is no longer ongoing
		{
			std::lock_guard<std::mutex> guard(socket_mutex_);
			socket_requests_in_flight_ -= 1;
			if (socket_requests_in_flight_ <= 0) {
				assert(socket_requests_in_flight_ == 0);
				socket_requests_are_from_thread_ = std::thread::id();
			}

			if (socket_should_be_closed_when_request_is_done_ || close_connection ||
				!ret) {
				shutdown_ssl(socket_, true);
				shutdown_socket(socket_);
				close_socket(socket_);
			}
		}

		if (!ret) {
			if (error == Error::Success) { error = Error::Unknown; }
		}

		return ret;
	}